

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  size_t sVar1;
  undefined1 *puVar2;
  char *pcVar3;
  ulong uVar4;
  char in_DL;
  string *in_RSI;
  ulong in_RDI;
  size_t loc;
  string closures;
  size_type bracket_loc;
  ulong in_stack_ffffffffffffff30;
  char cVar5;
  undefined1 *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  undefined1 *local_68;
  allocator local_49;
  string local_48 [32];
  long local_28;
  char local_19;
  string *local_18;
  ulong local_10;
  undefined1 *local_8;
  
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = ::std::__cxx11::string::find('x',(ulong)(uint)(int)in_DL);
  cVar5 = (char)(in_stack_ffffffffffffff30 >> 0x38);
  if (local_28 != -1) {
    if (local_28 == 0) {
      sVar1 = close_string_quote(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,cVar5);
      return sVar1;
    }
    if (1 < local_28 - 1U) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_48,1,local_19,&local_49);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
      while( true ) {
        local_68 = &local_18->field_0x1;
        puVar2 = (undefined1 *)::std::__cxx11::string::size();
        if (puVar2 <= local_68) break;
        pcVar3 = (char *)::std::__cxx11::string::operator[](local_10);
        cVar5 = *pcVar3;
        pcVar3 = (char *)::std::__cxx11::string::back();
        if (cVar5 == *pcVar3) {
          ::std::__cxx11::string::pop_back();
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) != 0) goto LAB_0017375c;
        }
        pcVar3 = (char *)::std::__cxx11::string::operator[](local_10);
        local_28 = ::std::__cxx11::string::find('X',(ulong)(uint)(int)*pcVar3);
        uVar4 = local_10;
        local_18 = (string *)local_68;
        if (local_28 != -1) {
          if (local_28 == 0) {
            ::std::__cxx11::string::operator[](local_10);
            local_18 = (string *)
                       close_string_quote(in_stack_ffffffffffffff40,
                                          (size_t)in_stack_ffffffffffffff38,
                                          (char)(in_stack_ffffffffffffff30 >> 0x38));
          }
          else if (local_28 - 1U < 2) {
            ::std::__cxx11::string::operator[](local_10);
            in_stack_ffffffffffffff40 =
                 (string *)
                 close_literal_quote(in_stack_ffffffffffffff40,(size_t)local_68,
                                     (char)(uVar4 >> 0x38));
            in_stack_ffffffffffffff30 = uVar4;
            in_stack_ffffffffffffff38 = local_68;
            local_18 = in_stack_ffffffffffffff40;
          }
          else {
            ::std::__cxx11::string::operator[](0x1b7978);
            ::std::__cxx11::string::push_back((char)local_48);
          }
        }
      }
      puVar2 = (undefined1 *)::std::__cxx11::string::size();
      if (puVar2 < local_68) {
        local_68 = (undefined1 *)::std::__cxx11::string::size();
      }
LAB_0017375c:
      local_8 = local_68;
      ::std::__cxx11::string::~string(local_48);
      return (size_t)local_8;
    }
  }
  sVar1 = close_literal_quote(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,cVar5);
  return sVar1;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
    case std::string::npos:
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}